

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

xmlParserInputPtr xmlNoNetExternalEntityLoader(char *URL,char *ID,xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  uint uVar2;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = ctxt->options;
    ctxt->options = uVar2 | 0x800;
  }
  pxVar1 = xmlDefaultExternalEntityLoader(URL,ID,ctxt);
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    ctxt->options = uVar2;
  }
  return pxVar1;
}

Assistant:

xmlParserInputPtr
xmlNoNetExternalEntityLoader(const char *URL, const char *ID,
                             xmlParserCtxtPtr ctxt) {
    int oldOptions = 0;
    xmlParserInputPtr input;

    if (ctxt != NULL) {
        oldOptions = ctxt->options;
        ctxt->options |= XML_PARSE_NONET;
    }

    input = xmlDefaultExternalEntityLoader(URL, ID, ctxt);

    if (ctxt != NULL)
        ctxt->options = oldOptions;

    return(input);
}